

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  ImGuiViewportP *this;
  ImGuiPlatformMonitor *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiViewportP *local_40;
  ImGuiViewportP *viewport;
  ImGuiContext *g;
  ImVec2 *pIStack_28;
  ImGuiViewportFlags flags_local;
  ImVec2 *size_local;
  ImVec2 *pos_local;
  ImGuiWindow *pIStack_10;
  ImGuiID id_local;
  ImGuiWindow *window_local;
  
  viewport = (ImGuiViewportP *)GImGui;
  g._4_4_ = flags;
  pIStack_28 = size;
  size_local = pos;
  pos_local._4_4_ = id;
  pIStack_10 = window;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2c3c,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  if (window != (ImGuiWindow *)0x0) {
    if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && (GImGui->MovingWindow->RootWindow == window)
       ) {
      g._4_4_ = flags | 0x14;
    }
    if (((window->Flags & 0x200U) != 0) && ((window->Flags & 0x40000U) != 0)) {
      g._4_4_ = g._4_4_ | 0x10;
    }
    if ((window->Flags & 0x1000U) != 0) {
      g._4_4_ = g._4_4_ | 4;
    }
  }
  local_40 = (ImGuiViewportP *)FindViewportByID(id);
  if (local_40 == (ImGuiViewportP *)0x0) {
    MemAlloc(0x130);
    this = (ImGuiViewportP *)operator_new(0x130);
    ImGuiViewportP::ImGuiViewportP(this);
    (this->super_ImGuiViewport).ID = pos_local._4_4_;
    *(int *)&(this->super_ImGuiViewport).field_0x64 = viewport[0x18].DrawDataP.CmdListsCount;
    this->LastPos = *size_local;
    (this->super_ImGuiViewport).Pos = this->LastPos;
    (this->super_ImGuiViewport).Size = *pIStack_28;
    (this->super_ImGuiViewport).Flags = g._4_4_;
    local_40 = this;
    UpdateViewportPlatformMonitor(this);
    ImVector<ImGuiViewportP_*>::push_back
              ((ImVector<ImGuiViewportP_*> *)&viewport[0x18].DrawDataP.CmdListsCount,&local_40);
    fVar3 = ImMin<float>(*(float *)((long)&viewport[0x16].super_ImGuiViewport.DrawData + 4),
                         (local_40->super_ImGuiViewport).Pos.x);
    *(float *)((long)&viewport[0x16].super_ImGuiViewport.DrawData + 4) = fVar3;
    fVar3 = ImMin<float>((float)viewport[0x16].super_ImGuiViewport.ParentViewportId,
                         (local_40->super_ImGuiViewport).Pos.y);
    viewport[0x16].super_ImGuiViewport.ParentViewportId = (ImGuiID)fVar3;
    fVar3 = ImMax<float>(*(float *)&viewport[0x16].super_ImGuiViewport.field_0x3c,
                         (local_40->super_ImGuiViewport).Pos.x +
                         (local_40->super_ImGuiViewport).Size.x);
    *(float *)&viewport[0x16].super_ImGuiViewport.field_0x3c = fVar3;
    fVar3 = ImMax<float>(*(float *)&viewport[0x16].super_ImGuiViewport.RendererUserData,
                         (local_40->super_ImGuiViewport).Pos.y +
                         (local_40->super_ImGuiViewport).Size.y);
    *(float *)&viewport[0x16].super_ImGuiViewport.RendererUserData = fVar3;
    if (local_40->PlatformMonitor != -1) {
      pIVar1 = ImVector<ImGuiPlatformMonitor>::operator[]
                         ((ImVector<ImGuiPlatformMonitor> *)&viewport[0x12].DrawDataP.CmdListsCount,
                          (int)local_40->PlatformMonitor);
      (local_40->super_ImGuiViewport).DpiScale = pIVar1->DpiScale;
    }
  }
  else {
    if (((local_40->super_ImGuiViewport).PlatformRequestMove & 1U) == 0) {
      (local_40->super_ImGuiViewport).Pos = *size_local;
    }
    if (((local_40->super_ImGuiViewport).PlatformRequestResize & 1U) == 0) {
      (local_40->super_ImGuiViewport).Size = *pIStack_28;
    }
    (local_40->super_ImGuiViewport).Flags = g._4_4_ | (local_40->super_ImGuiViewport).Flags & 0x80U;
  }
  local_40->Window = pIStack_10;
  local_40->LastFrameActive = viewport[0x16].DrawDataBuilder.Layers[1].Size;
  bVar2 = true;
  if (pIStack_10 != (ImGuiWindow *)0x0) {
    bVar2 = (local_40->super_ImGuiViewport).ID == pIStack_10->ID;
  }
  if (bVar2) {
    if (pIStack_10 != (ImGuiWindow *)0x0) {
      pIStack_10->ViewportOwned = true;
    }
    return local_40;
  }
  __assert_fail("window == __null || viewport->ID == window->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                ,0x2c6d,
                "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
               );
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindow == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}